

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O1

void __thiscall Httpdata::Add_New_Connect(Httpdata *this,int fd)

{
  Epoll *this_00;
  channel *this_01;
  SP_channel conn_socket;
  SP_channel local_40;
  channel *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_01 = (channel *)operator_new(0x90);
  channel::channel(this_01,fd,0x80000001,readn,writen,(this->super_channel).time_round);
  this_01->_vptr_channel = (_func_int **)&PTR__Httpdata_00116cb0;
  local_30 = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Httpdata*>
            (&local_28,(Httpdata *)this_01);
  std::__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<Httpdata,Httpdata>
            ((__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2> *)&local_30,(Httpdata *)this_01);
  this_00 = (this->super_channel).attach_epoll;
  local_40.super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_30;
  local_40.super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_28._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  Epoll::Epoll_Add(this_00,&local_40,false);
  if (local_40.super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return;
}

Assistant:

void Httpdata::Add_New_Connect(int fd)
{
    //channel* conn_socket = new Httpdata(fd,EPOLLIN | EPOLLET,readn,writen,true);
    SP_channel conn_socket(new Httpdata(fd,EPOLLIN | EPOLLET,readn,writen,time_round));
    attach_epoll->Epoll_Add(conn_socket,false);
}